

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_z.cpp
# Opt level: O3

double dzasum(int n,complex<double> *x,int incx)

{
  long lVar1;
  double *pdVar2;
  double dVar3;
  
  dVar3 = 0.0;
  if (0 < incx && 0 < n) {
    if (incx == 1) {
      dVar3 = 0.0;
      lVar1 = 0;
      do {
        dVar3 = ABS(*(double *)(x->_M_value + lVar1 + 8)) +
                ABS(*(double *)(x->_M_value + lVar1)) + dVar3;
        lVar1 = lVar1 + 0x10;
      } while ((ulong)(uint)n << 4 != lVar1);
    }
    else {
      pdVar2 = (double *)(x->_M_value + 8);
      dVar3 = 0.0;
      do {
        dVar3 = ABS(*pdVar2) + ABS(pdVar2[-1]) + dVar3;
        pdVar2 = pdVar2 + (ulong)(uint)incx * 2;
        n = n + -1;
      } while (n != 0);
    }
  }
  return dVar3;
}

Assistant:

double dzasum ( int n, complex <double> x[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    DZASUM takes the sum of the absolute values of a complex <double> vector.
//
//  Discussion:
//
//    This routine uses double precision complex arithmetic.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for FORTRAN usage,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, pages 308-323, 1979.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, complex <double> X[], the vector.
//
//    Input, int INCX, the increment between successive entries of X.
//
//    Output, double DZASUM, the sum of the absolute values.
//
{
  int i;
  int ix;
  double value;

  value = 0.0;

  if ( n <= 0 || incx <= 0 )
  {
    return value;
  }

  if ( incx == 1 )
  {
    for ( i = 0; i < n; i++ )
    {
      value = value + fabs ( real ( x[i] ) )
                    + fabs ( imag ( x[i] ) );
    }
  }
  else
  {
    ix = 0;
    for ( i = 0; i < n; i++ )
    {
      value = value + fabs ( real ( x[ix] ) )
                    + fabs ( imag ( x[ix] ) );
      ix = ix + incx;
    }
  }
  return value;
}